

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree.h
# Opt level: O1

void __thiscall
st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
          (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *this)

{
  ~tree(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

virtual ~tree() { clear(); }